

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O1

int __thiscall
soplex::CLUFactor<double>::vSolveLeft
          (CLUFactor<double> *this,double eps,double *vec,int *idx,double *rhs,int *ridx,int rn)

{
  int iVar1;
  
  if ((this->l).updateType == 0) {
    iVar1 = solveUpdateLeft(this,eps,rhs,ridx,rn);
    iVar1 = solveUleft(this,eps,vec,idx,rhs,ridx,iVar1);
  }
  else {
    iVar1 = solveUleft(this,eps,vec,idx,rhs,ridx,rn);
    iVar1 = solveLleftForest(this,eps,vec,idx,iVar1);
  }
  if ((double)this->thedim * 0.1 < (double)((this->l).firstUpdate + iVar1)) {
    solveLleftNoNZ(this,vec);
    return 0;
  }
  iVar1 = solveLleft(this,eps,vec,idx,iVar1);
  return iVar1;
}

Assistant:

int CLUFactor<R>::vSolveLeft(R eps,
                             R* vec, int* idx,                       /* result */
                             R* rhs, int* ridx, int rn)            /* rhs    */
{

   if(!l.updateType)             /* no Forest-Tomlin Updates */
   {
      rn = solveUpdateLeft(eps, rhs, ridx, rn);
      rn = solveUleft(eps, vec, idx, rhs, ridx, rn);
   }
   else
   {
      rn = solveUleft(eps, vec, idx, rhs, ridx, rn);
      rn = solveLleftForest(eps, vec, idx, rn);
   }

   // TODO verify the correctness of this check
   if(rn + l.firstUpdate > verySparseFactor4left * thedim)
   {
      // perform the dense solve
      solveLleftNoNZ(vec);
      // signal the caller that the nonzero pattern is lost
      return 0;
   }
   else
      return solveLleft(eps, vec, idx, rn);
}